

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSpeedup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVeryVerbose;
  int iVar4;
  uint fUseLutLib;
  char *pcVar5;
  uint fVerbose;
  bool bVar6;
  uint local_48;
  uint local_44;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fUseLutLib = 0;
  Extra_UtilGetoptReset();
  local_44 = 2;
  local_48 = 5;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_0024a905:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"PNlvwh"), iVar4 = globalUtilOptind, iVar1 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar1 < 0x50) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else if (pAVar2->ntkType == ABC_NTK_LOGIC) {
          pAVar2 = Abc_NtkSpeedup(pAVar2,fUseLutLib,local_48,local_44,fVerbose,fVeryVerbose);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar3 = "The command has failed.\n";
        }
        else {
          pcVar3 = "This command can only be applied to a logic network.\n";
        }
        iVar4 = -1;
        goto LAB_0024ab49;
      }
      if (iVar1 != 0x4e) goto LAB_0024aa67;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_0024aa5b:
        Abc_Print(-1,pcVar3);
        goto LAB_0024aa67;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      bVar6 = local_44 - 6 < 0xfffffffb;
    }
    else {
      if (iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
        goto LAB_0024a905;
      }
      if (iVar1 == 0x6c) {
        fUseLutLib = fUseLutLib ^ 1;
        goto LAB_0024a905;
      }
      if (iVar1 != 0x50) goto LAB_0024aa67;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_0024aa5b;
      }
      local_48 = atoi(argv[globalUtilOptind]);
      bVar6 = local_48 - 0x65 < 0xffffff9c;
    }
    globalUtilOptind = iVar4 + 1;
    if (bVar6) {
LAB_0024aa67:
      Abc_Print(-2,"usage: speedup [-PN <num>] [-lvwh]\n");
      Abc_Print(-2,"\t           transforms LUT-mapped network into an AIG with choices;\n");
      Abc_Print(-2,"\t           the choices are added to speedup the next round of mapping\n");
      Abc_Print(-2,
                "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n"
                ,(ulong)local_48);
      Abc_Print(-2,
                "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n"
                ,(ulong)local_44);
      pcVar3 = "lib";
      if (fUseLutLib == 0) {
        pcVar3 = "unit";
      }
      Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",
                pcVar3);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
      if (fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar5);
      pcVar3 = "\t-h       : print the command usage\n";
      iVar4 = -2;
LAB_0024ab49:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSpeedup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fUseLutLib;
    int Percentage;
    int Degree;
    int fVerbose;
    int fVeryVerbose;
    extern Abc_Ntk_t * Abc_NtkSpeedup( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fUseLutLib = 0;
    Percentage = 5;
    Degree     = 2;
    fVerbose   = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PNlvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            Percentage = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Percentage < 1 || Percentage > 100 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            Degree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Degree < 1 || Degree > 5 )
                goto usage;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    pNtkRes = Abc_NtkSpeedup( pNtk, fUseLutLib, Percentage, Degree, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: speedup [-PN <num>] [-lvwh]\n" );
    Abc_Print( -2, "\t           transforms LUT-mapped network into an AIG with choices;\n" );
    Abc_Print( -2, "\t           the choices are added to speedup the next round of mapping\n" );
    Abc_Print( -2, "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n", Percentage );
    Abc_Print( -2, "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n", Degree );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib" : "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}